

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

void __thiscall r_exec::Group::inject(Group *this,View *view)

{
  atomic_int_fast64_t *paVar1;
  multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
  *this_00;
  _Object *p_Var2;
  AntiPGMController *pAVar3;
  CSTController *pCVar4;
  MDLController *pMVar5;
  InputLessPGMController *pIVar6;
  View *pVVar7;
  undefined1 uVar8;
  char cVar9;
  ushort uVar10;
  int iVar11;
  undefined4 extraout_var;
  ulong uVar12;
  Controller *pCVar13;
  AntiPGMController *this_01;
  _Mem *p_Var14;
  TimeJob *pTVar15;
  uint64_t uVar16;
  CSTController *this_02;
  ostream *poVar17;
  MDLController *this_03;
  Group *pGVar18;
  Controller *pCVar19;
  InputLessPGMController *this_04;
  mapped_type *pmVar20;
  _Rb_tree_node_base *p_Var21;
  float fVar22;
  float fVar23;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar24;
  Atom a;
  bool inject_in_secondary_group;
  undefined4 local_64;
  string local_60;
  key_type local_40;
  pthread_mutex_t *local_38;
  
  iVar11 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar11 != 0) {
    std::__throw_system_error(iVar11);
  }
  p_Var2 = (view->super_View).object.object;
  local_38 = (pthread_mutex_t *)&this->mutex;
  iVar11 = (*p_Var2->_vptr__Object[4])(p_Var2,0);
  local_64 = *(undefined4 *)CONCAT44(extraout_var,iVar11);
  uVar12 = (*Now)();
  uVar10 = r_code::Atom::asIndex();
  r_code::Utils::SetTimestamp
            ((Atom *)((long)(view->super_View).references + (ulong)uVar10 * 4 + 0x18),uVar12);
  uVar8 = r_code::Atom::getDescriptor();
  switch(uVar8) {
  case 0xc3:
    local_60._M_dataplus._M_p = (pointer)r_exec::View::get_oid(view);
    pmVar20 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->other_views,(key_type *)&local_60);
    goto LAB_0017047f;
  case 0xc4:
    local_60._M_dataplus._M_p = (pointer)r_exec::View::get_oid(view);
    pmVar20 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->other_views,(key_type *)&local_60);
LAB_0017047f:
    pVVar7 = (View *)pmVar20->object;
    if (pVVar7 != view) {
      if (pVVar7 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar7->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar7->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar7->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar20->object = (_Object *)view;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    cov(this,view);
    break;
  case 0xc9:
    local_60._M_dataplus._M_p = (pointer)r_exec::View::get_oid(view);
    pmVar20 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)&local_60);
    pVVar7 = (View *)pmVar20->object;
    if (pVVar7 != view) {
      if (pVVar7 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar7->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar7->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar7->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar20->object = (_Object *)view;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    pCVar13 = (Controller *)operator_new(0xa0);
    PGMController::PGMController((PGMController *)pCVar13,&view->super_View);
    pCVar19 = (Controller *)(view->controller).object;
    if (pCVar19 != pCVar13) {
      if (pCVar19 != (Controller *)0x0) {
        LOCK();
        paVar1 = &(pCVar19->super__Object).refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pCVar19->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
          (*(pCVar19->super__Object)._vptr__Object[1])();
        }
      }
      (view->controller).object = (_Object *)pCVar13;
      LOCK();
      paVar1 = &(pCVar13->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    fVar22 = r_exec::View::get_act(view);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,3);
    fVar23 = (float)r_code::Atom::asFloat();
    if (fVar23 < fVar22) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,5);
      fVar22 = (float)r_code::Atom::asFloat();
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,6);
      fVar23 = (float)r_code::Atom::asFloat();
      if (fVar23 < fVar22) {
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,7);
        fVar22 = (float)r_code::Atom::asFloat();
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,8);
        fVar23 = (float)r_code::Atom::asFloat();
        if (fVar23 < fVar22) {
          (*(pCVar13->super__Object)._vptr__Object[5])(pCVar13);
          for (p_Var21 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              (_Rb_tree_header *)p_Var21 !=
              &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
              p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
            Controller::_take_input(pCVar13,*(View **)(p_Var21 + 1));
          }
        }
      }
    }
    break;
  case 0xca:
    local_60._M_dataplus._M_p = (pointer)r_exec::View::get_oid(view);
    pmVar20 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)&local_60);
    pVVar7 = (View *)pmVar20->object;
    if (pVVar7 != view) {
      if (pVVar7 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar7->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar7->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar7->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar20->object = (_Object *)view;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    r_code::Utils::GetString<r_code::Code>(&local_60,(Code *)(view->super_View).object.object,1);
    pCVar19 = CPPPrograms::New(&local_60,&view->super_View);
    if (pCVar19 == (Controller *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      goto LAB_001705bf;
    }
    pCVar13 = (Controller *)(view->controller).object;
    if (pCVar13 != pCVar19) {
      if (pCVar13 != (Controller *)0x0) {
        LOCK();
        paVar1 = &(pCVar13->super__Object).refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pCVar13->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
          (*(pCVar13->super__Object)._vptr__Object[1])();
        }
      }
      (view->controller).object = &pCVar19->super__Object;
      LOCK();
      paVar1 = &(pCVar19->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    fVar22 = r_exec::View::get_act(view);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,3);
    fVar23 = (float)r_code::Atom::asFloat();
    if (fVar23 < fVar22) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,5);
      fVar22 = (float)r_code::Atom::asFloat();
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,6);
      fVar23 = (float)r_code::Atom::asFloat();
      if (fVar23 < fVar22) {
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,7);
        fVar22 = (float)r_code::Atom::asFloat();
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,8);
        fVar23 = (float)r_code::Atom::asFloat();
        if (fVar23 < fVar22) {
          (*(pCVar19->super__Object)._vptr__Object[5])(pCVar19);
          for (p_Var21 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              (_Rb_tree_header *)p_Var21 !=
              &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
              p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
            Controller::_take_input(pCVar19,*(View **)(p_Var21 + 1));
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    break;
  case 0xcb:
    local_60._M_dataplus._M_p = (pointer)r_exec::View::get_oid(view);
    pmVar20 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->input_less_ipgm_views,(key_type *)&local_60);
    pVVar7 = (View *)pmVar20->object;
    if (pVVar7 != view) {
      if (pVVar7 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar7->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar7->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar7->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar20->object = (_Object *)view;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    this_04 = (InputLessPGMController *)operator_new(200);
    InputLessPGMController::InputLessPGMController(this_04,&view->super_View);
    pIVar6 = (InputLessPGMController *)(view->controller).object;
    if (pIVar6 != this_04) {
      if (pIVar6 != (InputLessPGMController *)0x0) {
        LOCK();
        paVar1 = &(pIVar6->super__PGMController).super_OController.super_Controller.super__Object.
                  refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pIVar6->super__PGMController).super_OController.super_Controller.super__Object.refCount
            .super___atomic_base<long>._M_i < 1) {
          (*(pIVar6->super__PGMController).super_OController.super_Controller.super__Object.
            _vptr__Object[1])();
        }
      }
      (view->controller).object = (_Object *)this_04;
      LOCK();
      paVar1 = &(this_04->super__PGMController).super_OController.super_Controller.super__Object.
                refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    fVar22 = r_exec::View::get_act(view);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,3);
    fVar23 = (float)r_code::Atom::asFloat();
    if (fVar23 < fVar22) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,5);
      fVar22 = (float)r_code::Atom::asFloat();
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,6);
      fVar23 = (float)r_code::Atom::asFloat();
      if (fVar23 < fVar22) {
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,7);
        fVar22 = (float)r_code::Atom::asFloat();
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,8);
        fVar23 = (float)r_code::Atom::asFloat();
        if (fVar23 < fVar22) {
          (*(this_04->super__PGMController).super_OController.super_Controller.super__Object.
            _vptr__Object[5])(this_04);
          p_Var14 = (_Mem *)r_code::Mem::Get();
          pTVar15 = (TimeJob *)operator_new(0x28);
          uVar16 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(view->super_View).object.object,4);
          InputLessPGMSignalingJob::InputLessPGMSignalingJob
                    ((InputLessPGMSignalingJob *)pTVar15,view,uVar16 + uVar12);
          _Mem::pushTimeJob(p_Var14,pTVar15);
        }
      }
    }
    break;
  case 0xcc:
    local_60._M_dataplus._M_p = (pointer)r_exec::View::get_oid(view);
    pmVar20 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->anti_ipgm_views,(key_type *)&local_60);
    pVVar7 = (View *)pmVar20->object;
    if (pVVar7 != view) {
      if (pVVar7 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar7->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar7->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar7->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar20->object = (_Object *)view;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    this_01 = (AntiPGMController *)operator_new(200);
    AntiPGMController::AntiPGMController(this_01,&view->super_View);
    pAVar3 = (AntiPGMController *)(view->controller).object;
    if (pAVar3 != this_01) {
      if (pAVar3 != (AntiPGMController *)0x0) {
        LOCK();
        paVar1 = &(pAVar3->super__PGMController).super_OController.super_Controller.super__Object.
                  refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pAVar3->super__PGMController).super_OController.super_Controller.super__Object.refCount
            .super___atomic_base<long>._M_i < 1) {
          (*(pAVar3->super__PGMController).super_OController.super_Controller.super__Object.
            _vptr__Object[1])();
        }
      }
      (view->controller).object = (_Object *)this_01;
      LOCK();
      paVar1 = &(this_01->super__PGMController).super_OController.super_Controller.super__Object.
                refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    fVar22 = r_exec::View::get_act(view);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,3);
    fVar23 = (float)r_code::Atom::asFloat();
    if (fVar23 < fVar22) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,5);
      fVar22 = (float)r_code::Atom::asFloat();
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,6);
      fVar23 = (float)r_code::Atom::asFloat();
      if (fVar23 < fVar22) {
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,7);
        fVar22 = (float)r_code::Atom::asFloat();
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,8);
        fVar23 = (float)r_code::Atom::asFloat();
        if (fVar23 < fVar22) {
          (*(this_01->super__PGMController).super_OController.super_Controller.super__Object.
            _vptr__Object[5])(this_01);
          for (p_Var21 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              (_Rb_tree_header *)p_Var21 !=
              &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
              p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
            Controller::_take_input((Controller *)this_01,*(View **)(p_Var21 + 1));
          }
          p_Var14 = (_Mem *)r_code::Mem::Get();
          pTVar15 = (TimeJob *)operator_new(0x28);
          uVar16 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(((this_01->super__PGMController).super_OController.
                                        super_Controller.view)->object).object,4);
          AntiPGMSignalingJob::AntiPGMSignalingJob
                    ((AntiPGMSignalingJob *)pTVar15,view,uVar16 + uVar12);
          _Mem::pushTimeJob(p_Var14,pTVar15);
        }
      }
    }
    break;
  case 0xcd:
    poVar17 = _Mem::Output(HLP_INJ);
    (*Now)();
    r_code::Utils::RelativeTime_abi_cxx11_((ulong)&local_60);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," cst ",5);
    (*((view->super_View).object.object)->_vptr__Object[2])();
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," injected",9);
    std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    local_60._M_dataplus._M_p = (pointer)r_exec::View::get_oid(view);
    pmVar20 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)&local_60);
    pVVar7 = (View *)pmVar20->object;
    if (pVVar7 != view) {
      if (pVVar7 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar7->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar7->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar7->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar20->object = (_Object *)view;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    this_02 = (CSTController *)operator_new(0x1e8);
    CSTController::CSTController(this_02,&view->super_View);
    pCVar4 = (CSTController *)(view->controller).object;
    if (pCVar4 != this_02) {
      if (pCVar4 != (CSTController *)0x0) {
        LOCK();
        paVar1 = &(pCVar4->super_HLPController).super_OController.super_Controller.super__Object.
                  refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pCVar4->super_HLPController).super_OController.super_Controller.super__Object.refCount.
            super___atomic_base<long>._M_i < 1) {
          (*(pCVar4->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[1])();
        }
      }
      (view->controller).object = (_Object *)this_02;
      LOCK();
      paVar1 = &(this_02->super_HLPController).super_OController.super_Controller.super__Object.
                refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    pGVar18 = get_secondary_group(this);
    CSTController::set_secondary_host(this_02,pGVar18);
    fVar22 = r_exec::View::get_act(view);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,3);
    fVar23 = (float)r_code::Atom::asFloat();
    if (fVar23 < fVar22) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,5);
      fVar22 = (float)r_code::Atom::asFloat();
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,6);
      fVar23 = (float)r_code::Atom::asFloat();
      if (fVar23 < fVar22) {
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,7);
        fVar22 = (float)r_code::Atom::asFloat();
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,8);
        fVar23 = (float)r_code::Atom::asFloat();
        if (fVar23 < fVar22) {
          (*(this_02->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[5])(this_02);
          for (p_Var21 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              (_Rb_tree_header *)p_Var21 !=
              &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
              p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
            Controller::_take_input((Controller *)this_02,*(View **)(p_Var21 + 1));
          }
        }
      }
    }
    break;
  case 0xce:
    poVar17 = _Mem::Output(HLP_INJ);
    (*Now)();
    r_code::Utils::RelativeTime_abi_cxx11_((ulong)&local_60);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," mdl ",5);
    (*((view->super_View).object.object)->_vptr__Object[2])();
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," injected",9);
    std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    local_60._M_dataplus._M_p = (pointer)r_exec::View::get_oid(view);
    pmVar20 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)&local_60);
    pVVar7 = (View *)pmVar20->object;
    if (pVVar7 != view) {
      if (pVVar7 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar7->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar7->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar7->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar20->object = (_Object *)view;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    this_03 = MDLController::New(view,(bool *)&local_60);
    pMVar5 = (MDLController *)(view->controller).object;
    if (pMVar5 != this_03) {
      if (pMVar5 != (MDLController *)0x0) {
        LOCK();
        paVar1 = &(pMVar5->super_HLPController).super_OController.super_Controller.super__Object.
                  refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pMVar5->super_HLPController).super_OController.super_Controller.super__Object.refCount.
            super___atomic_base<long>._M_i < 1) {
          (*(pMVar5->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[1])();
        }
      }
      (view->controller).object = (_Object *)this_03;
      if (this_03 != (MDLController *)0x0) {
        LOCK();
        paVar1 = &(this_03->super_HLPController).super_OController.super_Controller.super__Object.
                  refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
    }
    if ((char)local_60._M_dataplus._M_p == '\x01') {
      pGVar18 = get_secondary_group(this);
      inject_secondary_mdl_controller(pGVar18,view);
    }
    fVar22 = r_exec::View::get_act(view);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,3);
    fVar23 = (float)r_code::Atom::asFloat();
    if (fVar23 < fVar22) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,5);
      fVar22 = (float)r_code::Atom::asFloat();
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,6);
      fVar23 = (float)r_code::Atom::asFloat();
      if (fVar23 < fVar22) {
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,7);
        fVar22 = (float)r_code::Atom::asFloat();
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,8);
        fVar23 = (float)r_code::Atom::asFloat();
        if (fVar23 < fVar22) {
          (*(this_03->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[5])(this_03);
          for (p_Var21 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              (_Rb_tree_header *)p_Var21 !=
              &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
              p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
            Controller::_take_input((Controller *)this_03,*(View **)(p_Var21 + 1));
          }
        }
      }
    }
    break;
  case 0xcf:
    local_60._M_dataplus._M_p = (pointer)r_exec::View::get_oid(view);
    pmVar20 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)&local_60);
    pVVar7 = (View *)pmVar20->object;
    if (pVVar7 != view) {
      if (pVVar7 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar7->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar7->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar7->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar20->object = (_Object *)view;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    fVar22 = r_exec::View::get_act(view);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,3);
    fVar23 = (float)r_code::Atom::asFloat();
    if (fVar23 < fVar22) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,5);
      fVar22 = (float)r_code::Atom::asFloat();
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,6);
      fVar23 = (float)r_code::Atom::asFloat();
      if (fVar23 < fVar22) {
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,7);
        fVar22 = (float)r_code::Atom::asFloat();
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,8);
        fVar23 = (float)r_code::Atom::asFloat();
        if (fVar23 < fVar22) {
          (*((view->controller).object)->_vptr__Object[5])();
          cVar9 = r_code::Atom::takesPastInputs();
          if (cVar9 != '\0') {
            for (p_Var21 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left;
                (_Rb_tree_header *)p_Var21 !=
                &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
                p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
              Controller::_take_input
                        ((Controller *)(view->controller).object,*(View **)(p_Var21 + 1));
            }
          }
        }
      }
    }
  }
  fVar22 = r_exec::View::get_sln(view);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,2);
  fVar23 = (float)r_code::Atom::asFloat();
  if (fVar23 < fVar22) {
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,5);
    fVar22 = (float)r_code::Atom::asFloat();
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,6);
    fVar23 = (float)r_code::Atom::asFloat();
    if (fVar23 < fVar22) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,7);
      fVar22 = (float)r_code::Atom::asFloat();
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,8);
      fVar23 = (float)r_code::Atom::asFloat();
      if (fVar23 < fVar22) {
        this_00 = &this->newly_salient_views;
        LOCK();
        paVar1 = &(view->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        local_40.object = (_Object *)view;
        pVar24 = std::
                 _Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                 ::_M_get_insert_equal_pos(&this_00->_M_t,&local_40);
        local_60._M_dataplus._M_p = (pointer)this_00;
        std::
        _Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
        ::
        _M_insert_<core::P<r_exec::View>,std::_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>::_Alloc_node>
                  ((_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                    *)this_00,pVar24.first,pVar24.second,&local_40,(_Alloc_node *)&local_60);
        if ((View *)local_40.object != (View *)0x0) {
          LOCK();
          ((local_40.object)->refCount).super___atomic_base<long>._M_i =
               ((local_40.object)->refCount).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if (((local_40.object)->refCount).super___atomic_base<long>._M_i < 1) {
            (*(((View *)&(local_40.object)->_vptr__Object)->super__Object)._vptr__Object[1])();
          }
        }
        inject_reduction_jobs(this,view);
      }
    }
  }
LAB_001705bf:
  r_code::Atom::~Atom((Atom *)&local_64);
  pthread_mutex_unlock(local_38);
  return;
}

Assistant:

void Group::inject(View *view)
{
    std::lock_guard<std::mutex> guard(mutex);
    Atom a = view->object->code(0);
    uint64_t now = Now();
    view->set_ijt(now);

    switch (a.getDescriptor()) {
    case Atom::NULL_PROGRAM: // the view comes with a controller.
        ipgm_views[view->get_oid()] = view;

        if (is_active_pgm(view)) {
            view->controller->gain_activation();

            if (a.takesPastInputs()) {
                std::multiset<P<View>, r_code::View::Less>::const_iterator v;

                for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                    view->controller->_take_input(*v);    // view will be copied.
                }
            }
        }

        break;

    case Atom::INSTANTIATED_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        PGMController *c = new PGMController(view);
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }
        }

        break;
    }

    case Atom::INSTANTIATED_CPP_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        std::string str = Utils::GetString<Code>(view->object, ICPP_PGM_NAME);
        Controller *c = CPPPrograms::New(str, view);

        if (!c) {
            return;
        }

        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }
        }

        break;
    }

    case Atom::INSTANTIATED_ANTI_PROGRAM: {
        anti_ipgm_views[view->get_oid()] = view;
        AntiPGMController *c = new AntiPGMController(view);
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }

            _Mem::Get()->pushTimeJob(new AntiPGMSignalingJob(view, now + Utils::GetTimestamp<Code>(c->getObject(), IPGM_TSC)));
        }

        break;
    }

    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM: {
        input_less_ipgm_views[view->get_oid()] = view;
        InputLessPGMController *c = new InputLessPGMController(view);
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            _Mem::Get()->pushTimeJob(new InputLessPGMSignalingJob(view, now + Utils::GetTimestamp<Code>(view->object, IPGM_TSC)));
        }

        break;
    }

    case Atom::MARKER: // the marker has already been added to the mks of its references.
        other_views[view->get_oid()] = view;
        cov(view);
        break;

    case Atom::OBJECT:
        other_views[view->get_oid()] = view;
        cov(view);
        break;

    case Atom::COMPOSITE_STATE: {
        OUTPUT(HLP_INJ) << Utils::RelativeTime(Now()) << " cst " << view->object->get_oid() << " injected" << std::endl;
        ipgm_views[view->get_oid()] = view;
        CSTController *c = new CSTController(view);
        view->controller = c;
        c->set_secondary_host(get_secondary_group());

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }
        }

        break;
    }

    case Atom::MODEL: {
        OUTPUT(HLP_INJ) << Utils::RelativeTime(Now()) << " mdl " << view->object->get_oid() << " injected" << std::endl;
        ipgm_views[view->get_oid()] = view;
        bool inject_in_secondary_group;
        MDLController *c = MDLController::New(view, inject_in_secondary_group);
        view->controller = c;

        if (inject_in_secondary_group) {
            get_secondary_group()->inject_secondary_mdl_controller(view);
        }

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->Controller::_take_input(*v);    // view will be copied.
            }
        }

        break;
    }
    }

    if (is_eligible_input(view)) { // have existing programs reduce the new view.
        newly_salient_views.insert(view);
        inject_reduction_jobs(view);
    }

    //if(get_oid()==2)
    // std::cout<<Utils::RelativeTime(Now())<<" stdin <- "<<view->object->get_oid()<<std::endl;
}